

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_77::AsyncTee::SinkBase<unsigned_long>::SinkBase
          (SinkBase<unsigned_long> *this,PromiseFulfiller<unsigned_int> *fulfiller,
          Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&> *sinkLink)

{
  bool bVar1;
  Fault local_28;
  Fault f;
  Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&> *sinkLink_local;
  PromiseFulfiller<unsigned_int> *fulfiller_local;
  SinkBase<unsigned_long> *this_local;
  
  f.exception = (Exception *)sinkLink;
  Sink::Sink(&this->super_Sink);
  (this->super_Sink)._vptr_Sink = (_func_int **)&PTR___cxa_pure_virtual_007dba30;
  this->fulfiller = fulfiller;
  this->sinkLink = (Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&> *)f.exception;
  bVar1 = Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&>::operator==
                    ((Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&> *)f.exception,(void *)0x0);
  if (!bVar1) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[43]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io.c++"
               ,0x550,FAILED,"sinkLink == nullptr","\"sink initiated with sink already in flight\"",
               (char (*) [43])"sink initiated with sink already in flight");
    _::Debug::Fault::fatal(&local_28);
  }
  Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&>::operator=
            ((Maybe<kj::(anonymous_namespace)::AsyncTee::Sink_&> *)f.exception,&this->super_Sink);
  return;
}

Assistant:

explicit SinkBase(PromiseFulfiller<T>& fulfiller, Maybe<Sink&>& sinkLink)
        : fulfiller(fulfiller), sinkLink(sinkLink) {
      KJ_ASSERT(sinkLink == nullptr, "sink initiated with sink already in flight");
      sinkLink = *this;
    }